

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pretty-format.cpp
# Opt level: O1

void scan_invalid(void)

{
  fail_at_arg("#deadhorse",1,0x22c);
  fail_at_arg("#abcdefgh",1,0x22d);
  fail_at_arg("#",1,0x22e);
  fail_at_arg("2016:11:16",1,0x233);
  fail_at_arg("16.11.2016",1,0x234);
  fail_at_arg("2016-11-16 00:00:0",2,0x238);
  fail_at_arg("2016-11-16 00:00:00:1",2,0x239);
  fail_at_arg("2016-11-16 00:00:00 (...+0x0p-32s)",2,0x23b);
  fail_at_arg("2016-11-16 00:00:00.1 (. ..+0x0p-32s)",2,0x23c);
  fail_at_arg("2016-11-16 00:00:00.1 (. ..+0x0p+32s)",2,0x23d);
  fail_at_arg("1.2.3d",1,0x242);
  fail_at_arg("1dd",1,0x243);
  fail_at_arg("0xgp+1",1,0x248);
  fail_at_arg("1p+",1,0x249);
  fail_at_arg(".e3",1,0x24a);
  fail_at_arg("1 (-0x1.8p+0)",1,0x252);
  fail_at_arg("1.0 -0x1.8p+0)",3,0x253);
  fail_at_arg("1.0 (x1.8p+0)",1,0x254);
  fail_at_arg("1.0 (-0x1.8p+0",1,0x255);
  fail_at_arg("(-0x0p-32)",1,0x256);
  fail_at_arg("\'\'",1,0x25b);
  fail_at_arg("\'too many chars\'",1,0x25c);
  fail_at_arg("\'\\k\'",1,0x25d);
  fail_at_arg("\'\\\\\\\'",1,0x25e);
  fail_at_arg("42j",1,0x263);
  fail_at_arg("0xgg",1,0x264);
  fail_at_arg("0123Fh",1,0x265);
  fail_at_arg("MIDI x",1,0x26b);
  fail_at_arg("MIDI 0xff 0xff 0xff 0xff ]",1,0x26c);
  fail_at_arg("2 MIDI [ 0xff ]",2,0x26d);
  fail_at_arg("MIDI [ 0 0xff 0xff 0xff ]",1,0x26e);
  fail_at_arg("MIDI [ 0xff 0xff 0xff 0xff",1,0x26f);
  fail_at_arg("\"no endquote",1,0x274);
  fail_at_arg("\"\\\"no endquote 2",1,0x275);
  fail_at_arg("\\u",1,0x276);
  fail_at_arg("\\\\\\",1,0x277);
  fail_at_arg("identifier_with-minus-sign",2,0x27c);
  fail_at_arg("BLOB [",1,0x281);
  fail_at_arg("BLOB [ x ]",1,0x282);
  fail_at_arg("BLOB [ 1 ]",1,0x283);
  fail_at_arg("BLOB [ 2 0xff ]",1,0x284);
  fail_at_arg("BLOB [ 1 0xff 0xff ]",1,0x285);
  fail_at_arg("BLOB [ 0 0xff ]",1,0x286);
  fail_at_arg("BLOB [ 1 0xff 123 ]",1,0x287);
  fail_at_arg("BLOB [ 1 0xff ",1,0x288);
  fail_at_arg("BLOB [ 1 0xff",1,0x289);
  fail_at_arg("[0 1 2",4,0x28f);
  fail_at_arg("[0 2h]",3,0x290);
  fail_at_arg("... 25",1,0x299);
  fail_at_arg("4 ...",1,0x29a);
  fail_at_arg("6 ... 12h",1,0x29b);
  fail_at_arg("0.0 0.25 ... 1.1",2,0x29d);
  fail_at_arg("1.9f ... 0f",1,0x29e);
  fail_at_arg("[ ... 3 ]",2,0x29f);
  fail_at_arg("\"ranges don\'t work \" ... \"with strings\"",1,0x2a0);
  fail_at_arg("-4 ... -4",1,0x2a1);
  fail_at_arg("[] ... [1 2 3]",1,0x2a2);
  fail_at_arg("1 3 ... 11 ... 15",5,0x2a5);
  fail_at_arg("2x",1,0x2a7);
  fail_at_arg("1 ...",1,0x2aa);
  fail_at_arg("\"rtosc is\" true \"ly\" \'\a\' 0x6rea7 \"library\"",5,0x2b0);
  return;
}

Assistant:

void scan_invalid()
{
#define BAD(s) fail_at_arg(s, 1, __LINE__);

    /*
        simple types
    */
    // not testable: mistyped keywords like "tru" are considered
    // valid identifiers

    /*
        colors
    */
    BAD("#deadhorse");
    BAD("#abcdefgh");
    BAD("#");

    /*
        timestamps
    */
    BAD("2016:11:16");
    BAD("16.11.2016");
#if 0
    BAD("2016-11-16 00"); // correct: date + int
#endif
    fail_at_arg("2016-11-16 00:00:0", 2, __LINE__); // 2 digits needed
    fail_at_arg("2016-11-16 00:00:00:1", 2, __LINE__); // period needed
    fail_at_arg("2016-11-16 00:00:00 (...+0x0p-32s)", 2,
                __LINE__); // period needed
    fail_at_arg("2016-11-16 00:00:00.1 (. ..+0x0p-32s)", 2, __LINE__);
    fail_at_arg("2016-11-16 00:00:00.1 (. ..+0x0p+32s)", 2, __LINE__);

    /*
        doubles
    */
    BAD("1.2.3d");
    BAD("1dd");

    /*
        floats
    */
    BAD("0xgp+1"); // no hex char
    BAD("1p+"); // 0x missing
    BAD(".e3"); // numbers missing
#if 0
    // reading strtod(3p) these don't look legal,
    // but "unfortunately" they work
    BAD("0x1p+"); // exponent missing
    BAD("1.0e"); // exponent missing
#endif

    BAD("1 (-0x1.8p+0)"); // only floating numbers have postfix
    fail_at_arg("1.0 -0x1.8p+0)", 3, __LINE__); // read as 2 ints + ')'
    BAD("1.0 (x1.8p+0)");
    BAD("1.0 (-0x1.8p+0");
    BAD("(-0x0p-32)"); // parentheses not allowed

    /*
        chars
    */
    BAD("''");
    BAD("'too many chars'");
    BAD("'\\k'");
    BAD("'\\\\\\'"); // 3 backslashes

    /*
        integers
    */
    BAD("42j");
    BAD("0xgg");
    BAD("0123Fh");

    /*
        MIDI
    */
    // valid identifier + invalid blob
    BAD("MIDI x");
    BAD("MIDI 0xff 0xff 0xff 0xff ]");
    fail_at_arg("2 MIDI [ 0xff ]", 2, __LINE__);
    BAD("MIDI [ 0 0xff 0xff 0xff ]");
    BAD("MIDI [ 0xff 0xff 0xff 0xff");

    /*
        strings
    */
    BAD("\"no endquote");
    BAD("\"\\\"no endquote 2");
    BAD("\\u");
    BAD("\\\\\\"); // 3 backslashes

    /*
        identifier aka symbols
    */
    fail_at_arg("identifier_with-minus-sign", 2, __LINE__);

    /*
        blobs
    */
    BAD("BLOB [");
    BAD("BLOB [ x ]");
    BAD("BLOB [ 1 ]");
    BAD("BLOB [ 2 0xff ]");
    BAD("BLOB [ 1 0xff 0xff ]");
    BAD("BLOB [ 0 0xff ]");
    BAD("BLOB [ 1 0xff 123 ]");
    BAD("BLOB [ 1 0xff ");
    BAD("BLOB [ 1 0xff");

    /*
        arrays
    */
    // note: array start and array args each do count
    fail_at_arg("[0 1 2", 4, __LINE__);
    fail_at_arg("[0 2h]", 3, __LINE__);
//  this bad array is currently not detected (TODO):
//  fail_at_arg("[0.0 1 ... 5]", 3, __LINE__);

    /*
        ranges
    */
    // the results are sometimes a bit strange here,
    // but let's at least document that they do not change
    BAD("... 25");
    BAD("4 ...");
    BAD("6 ... 12h"); // different types
    // there's no natural number "n" with 0.25n = 1.1:
    fail_at_arg("0.0 0.25 ... 1.1", 2, __LINE__);
    BAD("1.9f ... 0f");
    fail_at_arg("[ ... 3 ]", 2, __LINE__); // what is the range start here?
    BAD("\"ranges don't work \" ... \"with strings\"");
    BAD("-4 ... -4");
    BAD("[] ... [1 2 3]"); // no arrays in ranges
    // this has been disallowed (intercepting ranges):
    // was the intention "... 11 12 13 14 15" or "... 11 13 15" ?
    fail_at_arg("1 3 ... 11 ... 15", 5 , __LINE__);

    BAD("2x");

    // infinite ranges
    BAD("1 ..."); // not allowed outside of bundle

    /*
        long message
    */
    fail_at_arg("\"rtosc is\" true \"ly\" '\a' 0x6rea7 \"library\"",
                5, __LINE__);

#undef BAD
}